

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void pnga_local_iterator_init(Integer g_a,_iterator_hdl *hdl)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long grp_00;
  Integer IVar4;
  long *in_RSI;
  long in_RDI;
  Integer _ndim_5;
  Integer _i_5;
  Integer _itmp_5;
  Integer _ndim_4;
  Integer _i_4;
  Integer _itmp_4;
  Integer me_2;
  int j_2;
  Integer _ndim_3;
  Integer _i_3;
  Integer _itmp_3;
  Integer _ndim_2;
  Integer _i_2;
  Integer _itmp_2;
  Integer me_1;
  int j_1;
  Integer _ndim_1;
  Integer _i_1;
  Integer _itmp_1;
  Integer _ndim;
  Integer _i;
  Integer _itmp;
  Integer me;
  int j;
  Integer grp;
  Integer ndim;
  Integer handle;
  long local_e0;
  long local_d8;
  long local_c8;
  long local_c0;
  int local_ac;
  long local_a0;
  long local_98;
  long local_88;
  long local_80;
  int local_6c;
  long local_60;
  long local_58;
  long local_48;
  long local_40;
  int local_2c;
  
  lVar2 = in_RDI + 1000;
  lVar3 = (long)GA[lVar2].ndim;
  grp_00 = (long)GA[lVar2].p_handle;
  *in_RSI = in_RDI;
  in_RSI[0xf] = 0;
  in_RSI[0x19] = 0;
  if (GA[lVar2].distr_type == 1) {
    IVar4 = pnga_pgroup_nodeid(grp_00);
    in_RSI[0xf] = IVar4;
  }
  else if (GA[lVar2].distr_type == 2) {
    local_58 = pnga_pgroup_nodeid(grp_00);
    for (local_2c = 0; local_2c < lVar3; local_2c = local_2c + 1) {
      in_RSI[(long)local_2c + 0x4b] = GA[lVar2].block_dims[local_2c];
      in_RSI[(long)local_2c + 0x28] = GA[lVar2].num_blocks[local_2c];
      in_RSI[(long)local_2c + 0x36] = (long)GA[lVar2].nblock[local_2c];
      in_RSI[(long)local_2c + 0x2f] = GA[lVar2].dims[local_2c];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x52] = local_58 % (long)GA[lVar2].nblock[0];
    local_40 = local_58;
    for (local_48 = 1; local_48 < sVar1; local_48 = local_48 + 1) {
      local_40 = (local_40 - in_RSI[local_48 + 0x51]) / (long)GA[lVar2].nblock[local_48 + -1];
      in_RSI[local_48 + 0x52] = local_40 % (long)GA[lVar2].nblock[local_48];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x59] = local_58 % (long)GA[lVar2].nblock[0];
    for (local_60 = 1; local_60 < sVar1; local_60 = local_60 + 1) {
      local_58 = (local_58 - in_RSI[local_60 + 0x58]) / (long)GA[lVar2].nblock[local_60 + -1];
      in_RSI[local_60 + 0x59] = local_58 % (long)GA[lVar2].nblock[local_60];
    }
  }
  else if (GA[lVar2].distr_type == 3) {
    local_98 = pnga_pgroup_nodeid(grp_00);
    for (local_6c = 0; local_6c < lVar3; local_6c = local_6c + 1) {
      in_RSI[(long)local_6c + 0x4b] = GA[lVar2].block_dims[local_6c];
      in_RSI[(long)local_6c + 0x28] = GA[lVar2].num_blocks[local_6c];
      in_RSI[(long)local_6c + 0x36] = (long)GA[lVar2].nblock[local_6c];
      in_RSI[(long)local_6c + 0x2f] = GA[lVar2].dims[local_6c];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x52] = local_98 % (long)GA[lVar2].nblock[0];
    local_80 = local_98;
    for (local_88 = 1; local_88 < sVar1; local_88 = local_88 + 1) {
      local_80 = (local_80 - in_RSI[local_88 + 0x51]) / (long)GA[lVar2].nblock[local_88 + -1];
      in_RSI[local_88 + 0x52] = local_80 % (long)GA[lVar2].nblock[local_88];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x59] = local_98 % (long)GA[lVar2].nblock[0];
    for (local_a0 = 1; local_a0 < sVar1; local_a0 = local_a0 + 1) {
      local_98 = (local_98 - in_RSI[local_a0 + 0x58]) / (long)GA[lVar2].nblock[local_a0 + -1];
      in_RSI[local_a0 + 0x59] = local_98 % (long)GA[lVar2].nblock[local_a0];
    }
  }
  else if (GA[lVar2].distr_type == 4) {
    local_d8 = pnga_pgroup_nodeid(grp_00);
    in_RSI[0x13] = (long)GA[lVar2].mapc;
    for (local_ac = 0; local_ac < lVar3; local_ac = local_ac + 1) {
      in_RSI[(long)local_ac + 0x28] = GA[lVar2].num_blocks[local_ac];
      in_RSI[(long)local_ac + 0x36] = (long)GA[lVar2].nblock[local_ac];
      in_RSI[(long)local_ac + 0x2f] = GA[lVar2].dims[local_ac];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x52] = local_d8 % (long)GA[lVar2].nblock[0];
    local_c0 = local_d8;
    for (local_c8 = 1; local_c8 < sVar1; local_c8 = local_c8 + 1) {
      local_c0 = (local_c0 - in_RSI[local_c8 + 0x51]) / (long)GA[lVar2].nblock[local_c8 + -1];
      in_RSI[local_c8 + 0x52] = local_c0 % (long)GA[lVar2].nblock[local_c8];
    }
    sVar1 = GA[lVar2].ndim;
    in_RSI[0x59] = local_d8 % (long)GA[lVar2].nblock[0];
    for (local_e0 = 1; local_e0 < sVar1; local_e0 = local_e0 + 1) {
      local_d8 = (local_d8 - in_RSI[local_e0 + 0x58]) / (long)GA[lVar2].nblock[local_e0 + -1];
      in_RSI[local_e0 + 0x59] = local_d8 % (long)GA[lVar2].nblock[local_e0];
    }
  }
  return;
}

Assistant:

void pnga_local_iterator_init(Integer g_a, _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  Integer grp = (Integer)GA[handle].p_handle;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  /* If standard GA distribution then no additional action needs to be taken */
  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->count = pnga_pgroup_nodeid(grp);
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, me, hdl->proc_index);
    gam_find_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED) {
    /* GA uses tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* GA uses irregular tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    hdl->mapc = GA[handle].mapc;
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  }
}